

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

int __thiscall gl4cts::ShaderSubroutineTests::init(ShaderSubroutineTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  FunctionalTest13 *this_00;
  FunctionalTest17 *this_01;
  
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"min_maxes",
             "Verifies the implementation returns valid GL_MAX_SUBROUTINE* pnames which meet the minimum maximum requirements enforced by the spec."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e640;
  *(undefined1 *)&pTVar2[1].m_testCtx = 1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"name_getters",
             "Verifies glGetActiveSubroutineName() and glGetActiveSubroutineUniformName() functions work correctly."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e6b0;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined1 *)&pTVar2[1].m_name._M_dataplus._M_p = 1;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  pTVar2[1].m_name._M_string_length = (size_type)"subroutine1";
  pTVar2[1].m_name.field_2._M_allocated_capacity = (size_type)"subroutine2";
  *(char **)((long)&pTVar2[1].m_name.field_2 + 8) = "data_provider";
  *(undefined4 *)&pTVar2[1].m_description._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"two_subroutines_single_subroutine_uniform",
             "Verifies the subroutines work correctly in a vertex shader for bool/float/int/uint/double/*vec*/*mat* argument and return types"
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__FunctionalTest1_2_0211e6e8;
  *(undefined1 *)&pTVar2[1].m_testCtx = 1;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0xffffffff00000000;
  *(undefined8 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0xffffffffffffffff;
  pTVar2[1].m_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )0x0;
  pTVar2[1].m_description._M_dataplus = (pointer)0x0;
  pTVar2[1].m_description._M_string_length = 0;
  *(undefined4 *)&pTVar2[1].m_description.field_2 = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"four_subroutines_with_two_uniforms",
             "Verify Get* API and draw calls");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e720;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xb8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"eight_subroutines_four_uniforms",
             "Verify multiple subroutine sets");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e758;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"static_subroutine_call",
             "Verify that subroutine can be called in a static manner");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e7b0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"arrayed_subroutine_uniforms",
             "Verify that subroutine can be called in a static manner");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e7e8;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x90);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,
             "subroutines_3_subroutine_types_and_subroutine_uniforms_one_function",
             "Makes sure that program with one function associated with 3 different subroutine types and 3 subroutine uniforms using that function compiles and works as expected"
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e820;
  *(undefined1 *)&pTVar2[1].m_testCtx = 1;
  *(undefined4 *)((long)&pTVar2[1].m_testCtx + 4) = 0x10;
  pTVar2[1].m_name._M_dataplus = (pointer)0x0;
  pTVar2[1].m_name._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xc0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"arrays_of_arrays_of_uniforms",
             "Verify that arrays of arrays of uniforms works as expected");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e858;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(200);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"globals_sampling_output_discard_function_calls",
             "Verify that global variables, texture sampling, fragment output, fragment discard and function calls work as expected"
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e890;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"ssbo_atomic_image_load_store",
             "Verify that SSBO, atomic counters and image load store work as expected");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e920;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_00 = (FunctionalTest13 *)operator_new(200);
  ShaderSubroutine::FunctionalTest13::FunctionalTest13
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar2 = (TestNode *)operator_new(0xb0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"structure_parameters_program_binary",
             "Verify structures can be used as parameters");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211e990;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x4f0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"subroutine_uniform_reset",
             "Checks that when the active program for a shader stage is re-linke or changed by a call to UseProgram, BindProgramPipeline, or UseProgramStages, subroutine uniforms for that stage are reset to arbitrarily chosen default functions with compatible subroutine types."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211ea00;
  *(undefined2 *)&pTVar2[1].m_testCtx = 0x100;
  *(undefined1 (*) [16])((long)&pTVar2[1].m_testCtx + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&pTVar2[1].m_name._M_string_length + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&pTVar2[1].m_name.field_2 + 0xc) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&pTVar2[1].m_description._M_string_length + 4) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&pTVar2[1].m_description.field_2 + 0xc) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   ((long)&pTVar2[1].m_children.
           super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = (undefined1  [16])0x0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_01 = (FunctionalTest17 *)operator_new(0xb8);
  ShaderSubroutine::FunctionalTest17::FunctionalTest17
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  pTVar2 = (TestNode *)operator_new(0xb0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,
             "control_flow_and_returned_subroutine_values_used_as_subroutine_input",
             "Makes sure that calling a subroutine with argument value returned by another subroutine works correctly. Also checks that subroutine and subroutine uniforms work as expected when used in connection with control flow functions."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211ea70;
  *(undefined1 *)&pTVar2[1].m_testCtx = 1;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0x10;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0xffffffff;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0xffffffff;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0xffffffff;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0xffffffff;
  *(undefined4 *)((long)&pTVar2[1].m_name.field_2 + 4) = 0xffffffff;
  *(undefined4 *)((long)&pTVar2[1].m_name.field_2 + 8) = 0xffffffff;
  *(undefined4 *)((long)&pTVar2[1].m_name.field_2 + 0xc) = 0xffffffff;
  *(undefined4 *)&pTVar2[1].m_description._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar2[1].m_description._M_dataplus._M_p + 4) = 0;
  *(undefined4 *)((long)&pTVar2[1].m_description._M_string_length + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xf0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"multiple_contexts",
             "Verifies that shader uniforms are preserved when rendering context is switched.");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211eaa8;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  pTVar2[1].m_name._M_dataplus = (pointer)0x0;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0;
  pTVar2[1].m_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )0x0;
  pTVar2[1].m_description._M_dataplus = (pointer)0x0;
  pTVar2[1].m_description._M_string_length = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa8);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"subroutine_errors",
             "Verifies all GL_INVALID_OPERATION, GL_INVALID_VALUE, GL_INVALID ENUM errors related to subroutine usage are properly generated."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211eaf0;
  *(undefined1 *)&pTVar2[1].m_testCtx = 1;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = 0;
  *(undefined4 *)&pTVar2[1].m_name._M_string_length = 0xffffffff;
  *(undefined4 *)((long)&pTVar2[1].m_name._M_string_length + 4) = 0xffffffff;
  *(undefined4 *)&pTVar2[1].m_name.field_2 = 0xffffffff;
  *(undefined4 *)((long)&pTVar2[1].m_name.field_2 + 4) = 0xffffffff;
  *(undefined4 *)((long)&pTVar2[1].m_name.field_2 + 8) = 0xffffffff;
  *(undefined8 *)((long)&pTVar2[1].m_name.field_2 + 0xc) = 0;
  *(undefined4 *)((long)&pTVar2[1].m_description._M_dataplus._M_p + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"subroutine_uniform_scope",
             "Verifies subroutine uniforms declared in shader stage Acannot be accessed from a different stage."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211eb28;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined1 *)&pTVar2[1].m_name._M_dataplus._M_p = 1;
  *(undefined1 (*) [16])((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = (undefined1  [16])0x0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"missing_subroutine_keyword",
             "Verifies that subroutine keyword is necessary when declaring a subroutine uniforn and a compilation error occurs without it."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211eb60;
  *(undefined1 *)&pTVar2[1].m_testCtx = 1;
  *(undefined4 *)((long)&pTVar2[1].m_testCtx + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"subroutines_incompatible_with_subroutine_type",
             "Verifies that a compile-time error is generated when arguments and return type do not match beween the function and each associated subroutine type."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211eb98;
  *(undefined1 *)&pTVar2[1].m_testCtx = 1;
  *(undefined4 *)((long)&pTVar2[1].m_testCtx + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"subroutine_uniform_wo_matching_subroutines",
             "Verifies that a link- or compile-time error occurs when trying to link a program with no subroutine for subroutine uniform variable."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211ebd0;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined1 *)&pTVar2[1].m_name._M_dataplus._M_p = 1;
  *(undefined1 (*) [16])((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = (undefined1  [16])0x0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"two_duplicate_functions_one_being_a_subroutine",
             "Verifies that a link- or compile-time error occurs if any shader in a program object includes two functions with the same name and one of which is associated with a subroutine type."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211ec08;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined1 *)&pTVar2[1].m_name._M_dataplus._M_p = 1;
  *(undefined1 (*) [16])((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = (undefined1  [16])0x0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"recursion",
             "Verify that it is not possible to build program with recursing subroutines");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211ec40;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x98);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"subroutine_wo_body",
             "Verifies that a compile- or link-time error occurs if a function declared as a subroutine does not include a body."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211ec78;
  pTVar2[1].m_testCtx = (TestContext *)0x0;
  *(undefined1 *)&pTVar2[1].m_name._M_dataplus._M_p = 1;
  *(undefined1 (*) [16])((long)&pTVar2[1].m_name._M_dataplus._M_p + 4) = (undefined1  [16])0x0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,
             "subroutines_cannot_be_assigned_float_int_values_or_be_compared",
             "Make sure it is not possible to assign float/int to subroutine uniform and that subroutine uniform values cannot be compared."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211ecb0;
  *(undefined1 *)&pTVar2[1].m_testCtx = 1;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xb0);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"function_overloading_forbidden_for_subroutines",
             "Check that an overloaded function cannot be declared with subroutine and a program will fail to compile or link if any shader or stage contains two or more  functions with the same name if the name is associated with a subroutine type."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__NegativeTest10_0211ece8;
  *(undefined1 *)&pTVar2[1].m_testCtx = 1;
  *(undefined1 (*) [16])((long)&pTVar2[1].m_testCtx + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&pTVar2[1].m_name._M_string_length + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&pTVar2[1].m_name.field_2 + 0xc) = (undefined1  [16])0x0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,
             "subroutine_uniforms_used_for_sampling_atomic_image_functions",
             "Tries to use subroutine uniforms in invalid way in sampling, atomic and image functions. Verifies that compile- or link-time error occurs."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211ed20;
  *(undefined1 *)&pTVar2[1].m_testCtx = 1;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x88);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,
             "subroutines_not_allowed_as_variables_constructors_and_argument_or_return_types",
             "Verifies that it is not allowed to use subroutine type for local/global variables, constructors or argument/return type."
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_0211ed58;
  *(undefined1 *)&pTVar2[1].m_testCtx = 1;
  *(undefined8 *)((long)&pTVar2[1].m_testCtx + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void ShaderSubroutineTests::init(void)
{
	addChild(new ShaderSubroutine::APITest1(m_context));
	addChild(new ShaderSubroutine::APITest2(m_context));
	addChild(new ShaderSubroutine::FunctionalTest1_2(m_context));
	addChild(new ShaderSubroutine::FunctionalTest3_4(m_context));
	addChild(new ShaderSubroutine::FunctionalTest5(m_context));
	addChild(new ShaderSubroutine::FunctionalTest6(m_context));
	addChild(new ShaderSubroutine::FunctionalTest7_8(m_context));
	addChild(new ShaderSubroutine::FunctionalTest9(m_context));
	addChild(new ShaderSubroutine::FunctionalTest10(m_context));
	addChild(new ShaderSubroutine::FunctionalTest11(m_context));
	addChild(new ShaderSubroutine::FunctionalTest12(m_context));
	addChild(new ShaderSubroutine::FunctionalTest13(m_context));
	addChild(new ShaderSubroutine::FunctionalTest14_15(m_context));
	addChild(new ShaderSubroutine::FunctionalTest16(m_context));
	addChild(new ShaderSubroutine::FunctionalTest17(m_context));
	addChild(new ShaderSubroutine::FunctionalTest18_19(m_context));
	addChild(new ShaderSubroutine::FunctionalTest20_21(m_context));
	addChild(new ShaderSubroutine::NegativeTest1(m_context));
	addChild(new ShaderSubroutine::NegativeTest2(m_context));
	addChild(new ShaderSubroutine::NegativeTest3(m_context));
	addChild(new ShaderSubroutine::NegativeTest4(m_context));
	addChild(new ShaderSubroutine::NegativeTest5(m_context));
	addChild(new ShaderSubroutine::NegativeTest6(m_context));
	addChild(new ShaderSubroutine::NegativeTest7(m_context));
	addChild(new ShaderSubroutine::NegativeTest8(m_context));
	addChild(new ShaderSubroutine::NegativeTest9(m_context));
	addChild(new ShaderSubroutine::NegativeTest10(m_context));
	addChild(new ShaderSubroutine::NegativeTest11(m_context));
	addChild(new ShaderSubroutine::NegativeTest12(m_context));
}